

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token.cc
# Opt level: O3

int TRUST_TOKEN_CLIENT_begin_redemption
              (TRUST_TOKEN_CLIENT *ctx,uint8_t **out,size_t *out_len,TRUST_TOKEN *token,
              uint8_t *data,size_t data_len,uint64_t time)

{
  int iVar1;
  CBB inner;
  CBB token_inner;
  CBB local_c0;
  CBB local_90;
  CBB local_60;
  
  iVar1 = CBB_init(&local_c0,0);
  if ((((iVar1 != 0) && (iVar1 = CBB_add_u16_length_prefixed(&local_c0,&local_60), iVar1 != 0)) &&
      (iVar1 = CBB_add_bytes(&local_60,token->data,token->len), iVar1 != 0)) &&
     ((((iVar1 = CBB_add_u16_length_prefixed(&local_c0,&local_90), iVar1 != 0 &&
        (iVar1 = CBB_add_bytes(&local_90,data,data_len), iVar1 != 0)) &&
       ((ctx->method->has_srr == 0 || (iVar1 = CBB_add_u64(&local_c0,time), iVar1 != 0)))) &&
      (iVar1 = CBB_finish(&local_c0,out,out_len), iVar1 != 0)))) {
    return 1;
  }
  CBB_cleanup(&local_c0);
  return 0;
}

Assistant:

int TRUST_TOKEN_CLIENT_begin_redemption(TRUST_TOKEN_CLIENT *ctx, uint8_t **out,
                                        size_t *out_len,
                                        const TRUST_TOKEN *token,
                                        const uint8_t *data, size_t data_len,
                                        uint64_t time) {
  CBB request, token_inner, inner;
  if (!CBB_init(&request, 0) ||
      !CBB_add_u16_length_prefixed(&request, &token_inner) ||
      !CBB_add_bytes(&token_inner, token->data, token->len) ||
      !CBB_add_u16_length_prefixed(&request, &inner) ||
      !CBB_add_bytes(&inner, data, data_len) ||
      (ctx->method->has_srr && !CBB_add_u64(&request, time)) ||
      !CBB_finish(&request, out, out_len)) {
    CBB_cleanup(&request);
    return 0;
  }
  return 1;
}